

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O3

Var __thiscall
Js::SourceTextModuleRecord::PostProcessDynamicModuleImport(SourceTextModuleRecord *this)

{
  Type *addr;
  ScriptContext *scriptContext;
  ThreadContext *pTVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  Data DVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  JavascriptPromise *pJVar9;
  JavascriptString *pJVar10;
  char16_t *pcVar11;
  Var pvVar12;
  undefined4 extraout_var_00;
  size_t sVar13;
  Recycler *this_00;
  long lVar14;
  JavascriptError *pError;
  void *__frameAddr;
  size_t sizeInBytes;
  PCWSTR message;
  size_t size;
  undefined1 local_78 [8];
  LeaveScriptObject<true,_true,_false> __leaveScriptObject;
  undefined4 extraout_var;
  
  scriptContext = (this->scriptContext).ptr;
  pJVar9 = (this->promise).ptr;
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                ,0x12f,"(scriptContext != nullptr)","scriptContext != nullptr");
    if (!bVar3) goto LAB_00b040c0;
    *puVar8 = 0;
  }
  addr = &this->promise;
  if (pJVar9 == (JavascriptPromise *)0x0) {
    pJVar9 = JavascriptPromise::CreateEnginePromise(scriptContext);
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pJVar9;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  if ((this->parentsNotified != true) || (this->wasDeclarationInitialized != false)) {
LAB_00b03ece:
    pvVar12 = JavascriptPromise::CreatePassThroughPromise(addr->ptr,scriptContext);
    return pvVar12;
  }
  iVar4 = (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[10])(this);
  if ((char)iVar4 != '\0') {
    (*(this->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0xb])(this);
  }
  if ((this->errorObject).ptr != (void *)0x0) {
    ReleaseParserResourcesForHierarchy(this);
    ResolveOrRejectDynamicImportPromise(false,(this->errorObject).ptr,scriptContext,this,false);
    goto LAB_00b03ece;
  }
  if ((this->hadNotifyHostReady != false) || ((this->super_ModuleRecordBase).wasEvaluated != false))
  goto LAB_00b03ece;
  pvVar12 = (this->normalizedSpecifier).ptr;
  if (pvVar12 == (Var)0x0) {
    pcVar11 = L"module";
  }
  else {
    pJVar10 = VarTo<Js::JavascriptString>(pvVar12);
    iVar4 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar10);
    pcVar11 = (char16_t *)CONCAT44(extraout_var,iVar4);
  }
  Output::TraceWithFlush
            (ModulePhase,L"\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n",
             pcVar11);
  if (scriptContext->threadContext->isScriptActive == true) {
    LeaveScriptObject<true,_true,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_78,scriptContext,
               &stack0xfffffffffffffff8);
    pTVar1 = scriptContext->threadContext;
    bVar3 = pTVar1->reentrancySafeOrHandled;
    pTVar1->reentrancySafeOrHandled = true;
    iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                      (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
    ThreadContext::DisposeOnLeaveScript(scriptContext->threadContext);
    pTVar1->reentrancySafeOrHandled = bVar3;
    LeaveScriptObject<true,_true,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_true,_false> *)local_78);
  }
  else {
    DVar5 = ExceptionCheck::Save();
    local_78._0_4_ = DVar5.handledExceptionType;
    iVar4 = (*scriptContext->hostScriptContext->_vptr_HostScriptContext[0x14])
                      (scriptContext->hostScriptContext,this,(this->errorObject).ptr);
    ExceptionCheck::Restore((Data *)local_78);
  }
  this->hadNotifyHostReady = true;
  if (-1 < iVar4) goto LAB_00b03ece;
  ReleaseParserResourcesForHierarchy(this);
  pvVar12 = (this->normalizedSpecifier).ptr;
  if (pvVar12 == (Var)0x0) {
    pcVar11 = L"module";
  }
  else {
    pJVar10 = VarTo<Js::JavascriptString>(pvVar12);
    iVar6 = (*(pJVar10->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject
              ._vptr_IRecyclerVisitedObject[0x65])(pJVar10);
    pcVar11 = (char16_t *)CONCAT44(extraout_var_00,iVar6);
  }
  sVar13 = PAL_wcslen(pcVar11);
  __leaveScriptObject.frameAddress = (void *)(sVar13 + 1);
  local_78 = (undefined1  [8])&char16_t::typeinfo;
  __leaveScriptObject.scriptContext = (ScriptContext *)0x0;
  __leaveScriptObject._16_8_ = anon_var_dwarf_59e0845;
  __leaveScriptObject.savedFPUControl.m_oldFpuControl = 0x15d;
  this_00 = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_78);
  lVar14 = sVar13 + 1;
  if (lVar14 == 0) {
    Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
    sizeInBytes = 0;
    message = (PCWSTR)&DAT_00000008;
  }
  else {
    sizeInBytes = lVar14 * 2;
    size = 0xffffffffffffffff;
    if (-1 < lVar14) {
      size = sizeInBytes;
    }
    __leaveScriptObject._32_8_ = this_00;
    BVar7 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00b040c0;
      *puVar8 = 0;
    }
    message = (PCWSTR)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                                ((Recycler *)__leaveScriptObject._32_8_,size);
    if (message == (PCWSTR)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00b040c0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar8 = 0;
      message = (PCWSTR)0x0;
    }
  }
  memcpy_s(message,sizeInBytes,pcVar11,sVar13 * 2);
  message[sVar13] = L'\0';
  pError = JavascriptLibrary::CreateURIError
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary);
  JavascriptError::SetErrorMessageProperties(pError,iVar4,message,scriptContext);
  pvVar12 = ResolveOrRejectDynamicImportPromise(false,pError,scriptContext,this,true);
  return pvVar12;
}

Assistant:

Var SourceTextModuleRecord::PostProcessDynamicModuleImport()
    {
        JavascriptPromise *promise = this->GetPromise();
        ScriptContext* scriptContext = GetScriptContext();
        AnalysisAssert(scriptContext != nullptr);
        if (promise == nullptr)
        {
            promise = JavascriptPromise::CreateEnginePromise(scriptContext);
            this->SetPromise(promise);
        }

        if (this->ParentsNotified())
        {
            HRESULT hr = NOERROR;
            if (!WasDeclarationInitialized())
            {
                if (ModuleDeclarationInstantiation())
                {
                    GenerateRootFunction();
                }

                if (this->errorObject != nullptr)
                {
                    // Cleanup in case of error.
                    this->ReleaseParserResourcesForHierarchy();
                    SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, this->errorObject, scriptContext, this, false);
                }
                else
                {
                    if (!hadNotifyHostReady && !WasEvaluated())
                    {
                        OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyHostAboutModuleReady %s (PostProcessDynamicModuleImport)\n"), this->GetSpecifierSz());
                        LEAVE_SCRIPT_IF_ACTIVE(scriptContext,
                        {
                            hr = scriptContext->GetHostScriptContext()->NotifyHostAboutModuleReady(this, this->errorObject);
                        });

                        hadNotifyHostReady = true;
                    }
                }
            }

            if (FAILED(hr))
            {
                // Cleanup in case of error.
                this->ReleaseParserResourcesForHierarchy();

                // We cannot just use the buffer in the specifier string - need to make a copy here.
                const char16* moduleName = this->GetSpecifierSz();
                size_t length = wcslen(moduleName);
                char16* allocatedString = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, length + 1);
                wmemcpy_s(allocatedString, length + 1, moduleName, length);
                allocatedString[length] = _u('\0');

                Js::JavascriptError * error = scriptContext->GetLibrary()->CreateURIError();
                JavascriptError::SetErrorMessageProperties(error, hr, allocatedString, scriptContext);
                return SourceTextModuleRecord::ResolveOrRejectDynamicImportPromise(false, error, scriptContext, this);
            }
        }

        return JavascriptPromise::CreatePassThroughPromise(this->promise, scriptContext);
    }